

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O2

void BZ2_compressBlock(EState *s,Bool_conflict is_last_block)

{
  UChar (*paUVar1) [258];
  Int32 (*paIVar2) [258];
  UChar UVar3;
  UChar UVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  UInt16 *pUVar56;
  uint v;
  long lVar57;
  long lVar58;
  Int32 (*paIVar59) [258];
  UInt32 *pUVar60;
  int iVar61;
  uint uVar62;
  ushort *puVar63;
  UChar (*paUVar64) [258];
  Bool_conflict *pBVar65;
  UChar rtmp2;
  int iVar66;
  ulong uVar67;
  UChar UVar68;
  int iVar69;
  uint uVar70;
  undefined7 in_register_00000031;
  ulong uVar71;
  ulong uVar72;
  bool bVar73;
  int iVar74;
  uint uVar75;
  Int32 IVar76;
  ulong uVar77;
  long lVar78;
  UChar *pUVar79;
  uint uVar80;
  ulong uVar81;
  ulong uVar82;
  bool bVar83;
  ulong local_198;
  Bool_conflict *local_178;
  UInt16 cost [6];
  UChar local_158 [20];
  undefined4 local_144;
  UInt32 *local_140;
  Int32 fave [6];
  
  IVar76 = s->nblock;
  if (0 < IVar76) {
    uVar80 = s->blockCRC;
    s->blockCRC = ~uVar80;
    s->combinedCRC = (s->combinedCRC << 1 | (uint)((int)s->combinedCRC < 0)) ^ ~uVar80;
    if (1 < s->blockNo) {
      s->numZ = 0;
    }
    if (1 < s->verbosity) {
      fprintf(_stderr,"    block %d: crc = 0x%08x, combined CRC = 0x%08x, size = %d\n");
    }
    BZ2_blockSort(s);
    IVar76 = s->nblock;
  }
  s->zbits = (UChar *)((long)IVar76 + (long)s->arr2);
  if (s->blockNo == 1) {
    s->bsBuff = 0;
    s->bsLive = 0;
    bsPutUChar(s,'B');
    bsPutUChar(s,'Z');
    bsPutUChar(s,'h');
    bsPutUChar(s,(char)s->blockSize100k + '0');
    IVar76 = s->nblock;
  }
  if (IVar76 < 1) goto LAB_001bc486;
  bsPutUChar(s,'1');
  bsPutUChar(s,'A');
  bsPutUChar(s,'Y');
  bsPutUChar(s,'&');
  bsPutUChar(s,'S');
  bsPutUChar(s,'Y');
  bsPutUInt32(s,s->blockCRC);
  uVar80 = 0;
  bsW(s,1,0);
  bsW(s,0x18,s->origPtr);
  pUVar60 = s->ptr;
  pUVar79 = s->block;
  pUVar56 = s->mtfv;
  s->nInUse = 0;
  local_178 = s->inUse;
  for (lVar57 = 0x80; lVar57 != 0x180; lVar57 = lVar57 + 1) {
    if (s->inUse[lVar57 + -0x80] != '\0') {
      s->inUse[lVar57 + 0x80] = (Bool_conflict)uVar80;
      uVar80 = uVar80 + 1;
      s->nInUse = uVar80;
    }
  }
  lVar58 = (long)(int)(uVar80 + 1);
  lVar57 = -1;
  lVar78 = lVar57;
  if (-1 < lVar58) {
    lVar78 = lVar58;
  }
  for (; lVar78 != lVar57; lVar57 = lVar57 + 1) {
    s->mtfFreq[lVar57 + 1] = 0;
  }
  uVar71 = 0;
  uVar72 = (ulong)uVar80;
  if ((int)uVar80 < 1) {
    uVar72 = uVar71;
  }
  for (; uVar72 != uVar71; uVar71 = uVar71 + 1) {
    *(char *)((long)fave + uVar71) = (char)uVar71;
  }
  lVar57 = 0;
  iVar74 = 0;
  iVar69 = 0;
  while( true ) {
    UVar68 = fave[0]._1_1_;
    if (s->nblock <= lVar57) break;
    UVar3 = s->unseqToSeq
            [pUVar79[(int)(((int)(pUVar60[lVar57] - 1) >> 0x1f & s->nblock) + pUVar60[lVar57] + -1)]
            ];
    if ((UChar)fave[0] == UVar3) {
      iVar69 = iVar69 + 1;
    }
    else {
      if (0 < iVar69) {
        uVar70 = iVar69 - 1;
        puVar63 = pUVar56 + iVar74;
        while( true ) {
          iVar74 = iVar74 + 1;
          bVar83 = (uVar70 & 1) != 0;
          if (bVar83) {
            s->mtfFreq[1] = s->mtfFreq[1] + 1;
          }
          else {
            s->mtfFreq[0] = s->mtfFreq[0] + 1;
          }
          *puVar63 = (ushort)bVar83;
          if ((int)uVar70 < 2) break;
          uVar70 = uVar70 - 2 >> 1;
          puVar63 = puVar63 + 1;
        }
        iVar69 = 0;
      }
      fave[0]._1_1_ = (UChar)fave[0];
      lVar78 = 2;
      while (UVar3 != UVar68) {
        UVar4 = *(UChar *)((long)fave + lVar78);
        *(UChar *)((long)fave + lVar78) = UVar68;
        lVar78 = lVar78 + 1;
        UVar68 = UVar4;
      }
      fave[0]._0_1_ = UVar3;
      pUVar56[iVar74] = (UInt16)lVar78;
      iVar74 = iVar74 + 1;
      s->mtfFreq[(int)lVar78] = s->mtfFreq[(int)lVar78] + 1;
    }
    lVar57 = lVar57 + 1;
  }
  if (0 < iVar69) {
    uVar70 = iVar69 - 1;
    puVar63 = pUVar56 + iVar74;
    while( true ) {
      iVar74 = iVar74 + 1;
      bVar83 = (uVar70 & 1) != 0;
      if (bVar83) {
        s->mtfFreq[1] = s->mtfFreq[1] + 1;
      }
      else {
        s->mtfFreq[0] = s->mtfFreq[0] + 1;
      }
      *puVar63 = (ushort)bVar83;
      if ((int)uVar70 < 2) break;
      uVar70 = uVar70 - 2 >> 1;
      puVar63 = puVar63 + 1;
    }
  }
  pUVar56[iVar74] = (UInt16)(uVar80 + 1);
  s->mtfFreq[lVar58] = s->mtfFreq[lVar58] + 1;
  s->nMTF = iVar74 + 1U;
  if (2 < s->verbosity) {
    fprintf(_stderr,"      %d in block, %d after MTF & 1-2 coding, %d+2 syms in use\n",
            (ulong)(uint)s->nblock,(ulong)(iVar74 + 1U),(ulong)(uint)s->nInUse);
  }
  iVar69 = s->nInUse;
  uVar80 = iVar69 + 2;
  paUVar1 = s->len;
  lVar57 = 0;
  uVar72 = 0;
  paUVar64 = paUVar1;
  if (0 < (int)uVar80) {
    uVar72 = (ulong)uVar80;
  }
  for (; lVar57 != 6; lVar57 = lVar57 + 1) {
    for (uVar71 = 0; uVar72 != uVar71; uVar71 = uVar71 + 1) {
      (*paUVar64)[uVar71] = '\x0f';
    }
    paUVar64 = paUVar64 + 1;
  }
  uVar70 = s->nMTF;
  if ((int)uVar70 < 1) {
    BZ2_bz__AssertH__fail(0xbb9);
    uVar70 = s->nMTF;
  }
  uVar71 = 0;
  local_144 = (int)CONCAT71(in_register_00000031,is_last_block);
  if ((int)uVar70 < 200) {
    v = 2;
LAB_001bb12c:
    bVar83 = false;
  }
  else {
    if (uVar70 < 600) {
      v = 3;
      goto LAB_001bb12c;
    }
    if (uVar70 < 0x4b0) {
      v = 4;
      goto LAB_001bb12c;
    }
    bVar83 = 0x95f < uVar70;
    v = bVar83 + 5;
  }
  uVar81 = (ulong)v;
  pUVar79 = s->selectorMtf + uVar81 * 0x102 + 0x4550;
  uVar77 = uVar81;
  while (0 < (long)uVar77) {
    iVar74 = (int)uVar71;
    uVar82 = (ulong)(iVar74 + -1);
    lVar57 = uVar82 << 0x20;
    uVar67 = 0;
    for (; (iVar66 = (int)uVar67, iVar66 < (int)uVar70 / (int)uVar77 &&
           ((long)uVar82 <= (long)iVar69)); uVar82 = uVar82 + 1) {
      uVar67 = (ulong)(uint)(iVar66 + s->mtfFreq[uVar82 + 1]);
      lVar57 = lVar57 + 0x100000000;
    }
    if (((iVar74 < (int)uVar82) && (uVar77 != 1 && uVar77 != uVar81)) &&
       ((v - (int)uVar77 & 0x80000001) == 1)) {
      uVar67 = (ulong)(uint)(iVar66 - *(int *)((long)s->mtfFreq + (lVar57 >> 0x1e)));
      uVar82 = (ulong)((int)uVar82 - 1);
    }
    if (2 < s->verbosity) {
      fprintf(_stderr,"      initial group %d, [%d .. %d], has %d syms (%4.1f%%)\n",
              ((double)(int)uVar67 * 100.0) / (double)s->nMTF,uVar77 & 0xffffffff,uVar71,
              uVar82 & 0xffffffff,uVar67);
    }
    uVar77 = uVar77 - 1;
    for (uVar71 = 0; uVar72 != uVar71; uVar71 = uVar71 + 1) {
      UVar68 = '\0';
      if ((long)(int)uVar82 < (long)uVar71) {
        UVar68 = '\x0f';
      }
      if ((long)uVar71 < (long)iVar74) {
        UVar68 = '\x0f';
      }
      pUVar79[uVar71] = UVar68;
    }
    uVar70 = uVar70 - (int)uVar67;
    pUVar79 = pUVar79 + -0x102;
    uVar71 = (ulong)((int)uVar82 + 1);
  }
  paIVar2 = s->rfreq;
  local_140 = s->len_pack[0] + 2;
  local_198 = 0;
  for (iVar69 = 0; iVar69 != 4; iVar69 = iVar69 + 1) {
    for (uVar71 = 0; uVar81 != uVar71; uVar71 = uVar71 + 1) {
      fave[uVar71] = 0;
    }
    paIVar59 = paIVar2;
    for (uVar71 = 0; uVar71 != uVar81; uVar71 = uVar71 + 1) {
      for (uVar77 = 0; uVar72 != uVar77; uVar77 = uVar77 + 1) {
        (*paIVar59)[uVar77] = 0;
      }
      paIVar59 = paIVar59 + 1;
    }
    if (bVar83) {
      pUVar60 = local_140;
      for (uVar71 = 0; uVar72 != uVar71; uVar71 = uVar71 + 1) {
        (*(UInt32 (*) [4])(pUVar60 + -2))[0] =
             (uint)s->len[0][uVar71] | (uint)s->len[1][uVar71] << 0x10;
        pUVar60[-1] = (uint)s->len[2][uVar71] | (uint)s->len[3][uVar71] << 0x10;
        *pUVar60 = (uint)s->len[4][uVar71] | (uint)s->len[5][uVar71] << 0x10;
        pUVar60 = pUVar60 + 4;
      }
    }
    local_198 = 0;
    iVar74 = 0;
    while (iVar66 = s->nMTF, iVar74 < iVar66) {
      for (uVar71 = 0; uVar81 != uVar71; uVar71 = uVar71 + 1) {
        cost[uVar71] = 0;
      }
      iVar61 = iVar66 + -1;
      if (iVar74 + 0x31 < iVar66) {
        iVar61 = iVar74 + 0x31;
      }
      lVar78 = (long)iVar74;
      bVar73 = (bool)(iVar61 - iVar74 == 0x31 & bVar83);
      lVar57 = lVar78;
      if (bVar73) {
        uVar6 = pUVar56[lVar78];
        uVar7 = pUVar56[lVar78 + 1];
        uVar8 = pUVar56[lVar78 + 2];
        uVar9 = pUVar56[lVar78 + 3];
        uVar10 = pUVar56[lVar78 + 4];
        uVar11 = pUVar56[lVar78 + 5];
        uVar12 = pUVar56[lVar78 + 6];
        uVar13 = pUVar56[lVar78 + 7];
        uVar14 = pUVar56[lVar78 + 8];
        uVar15 = pUVar56[lVar78 + 9];
        uVar16 = pUVar56[lVar78 + 10];
        uVar17 = pUVar56[lVar78 + 0xb];
        uVar18 = pUVar56[lVar78 + 0xc];
        uVar19 = pUVar56[lVar78 + 0xd];
        uVar20 = pUVar56[lVar78 + 0xe];
        uVar21 = pUVar56[lVar78 + 0xf];
        uVar22 = pUVar56[lVar78 + 0x10];
        uVar23 = pUVar56[lVar78 + 0x11];
        uVar24 = pUVar56[lVar78 + 0x12];
        uVar25 = pUVar56[lVar78 + 0x13];
        uVar26 = pUVar56[lVar78 + 0x14];
        uVar27 = pUVar56[lVar78 + 0x15];
        uVar28 = pUVar56[lVar78 + 0x16];
        uVar29 = pUVar56[lVar78 + 0x17];
        uVar30 = pUVar56[lVar78 + 0x18];
        uVar31 = pUVar56[lVar78 + 0x19];
        uVar32 = pUVar56[lVar78 + 0x1a];
        uVar33 = pUVar56[lVar78 + 0x1b];
        uVar34 = pUVar56[lVar78 + 0x1c];
        uVar35 = pUVar56[lVar78 + 0x1d];
        uVar36 = pUVar56[lVar78 + 0x1e];
        uVar37 = pUVar56[lVar78 + 0x1f];
        uVar38 = pUVar56[lVar78 + 0x20];
        uVar39 = pUVar56[lVar78 + 0x21];
        uVar40 = pUVar56[lVar78 + 0x22];
        uVar41 = pUVar56[lVar78 + 0x23];
        uVar42 = pUVar56[lVar78 + 0x24];
        uVar43 = pUVar56[lVar78 + 0x25];
        uVar44 = pUVar56[lVar78 + 0x26];
        uVar45 = pUVar56[lVar78 + 0x27];
        uVar46 = pUVar56[lVar78 + 0x28];
        uVar47 = pUVar56[lVar78 + 0x29];
        uVar48 = pUVar56[lVar78 + 0x2a];
        uVar49 = pUVar56[lVar78 + 0x2b];
        uVar50 = pUVar56[lVar78 + 0x2c];
        uVar51 = pUVar56[lVar78 + 0x2d];
        uVar52 = pUVar56[lVar78 + 0x2e];
        uVar53 = pUVar56[lVar78 + 0x2f];
        uVar54 = pUVar56[lVar78 + 0x30];
        uVar55 = pUVar56[lVar78 + 0x31];
        cost._0_4_ = s->len_pack[uVar7][0] + s->len_pack[uVar6][0] + s->len_pack[uVar8][0] +
                     s->len_pack[uVar9][0] + s->len_pack[uVar10][0] + s->len_pack[uVar11][0] +
                     s->len_pack[uVar12][0] + s->len_pack[uVar13][0] + s->len_pack[uVar14][0] +
                     s->len_pack[uVar15][0] + s->len_pack[uVar16][0] + s->len_pack[uVar17][0] +
                     s->len_pack[uVar18][0] + s->len_pack[uVar19][0] + s->len_pack[uVar20][0] +
                     s->len_pack[uVar21][0] + s->len_pack[uVar22][0] + s->len_pack[uVar23][0] +
                     s->len_pack[uVar24][0] + s->len_pack[uVar25][0] + s->len_pack[uVar26][0] +
                     s->len_pack[uVar27][0] + s->len_pack[uVar28][0] + s->len_pack[uVar29][0] +
                     s->len_pack[uVar30][0] + s->len_pack[uVar31][0] + s->len_pack[uVar32][0] +
                     s->len_pack[uVar33][0] + s->len_pack[uVar34][0] + s->len_pack[uVar35][0] +
                     s->len_pack[uVar36][0] + s->len_pack[uVar37][0] + s->len_pack[uVar38][0] +
                     s->len_pack[uVar39][0] + s->len_pack[uVar40][0] + s->len_pack[uVar41][0] +
                     s->len_pack[uVar42][0] + s->len_pack[uVar43][0] + s->len_pack[uVar44][0] +
                     s->len_pack[uVar45][0] + s->len_pack[uVar46][0] + s->len_pack[uVar47][0] +
                     s->len_pack[uVar48][0] + s->len_pack[uVar49][0] + s->len_pack[uVar50][0] +
                     s->len_pack[uVar51][0] + s->len_pack[uVar52][0] + s->len_pack[uVar53][0] +
                     s->len_pack[uVar54][0] + s->len_pack[uVar55][0];
        cost._4_4_ = s->len_pack[uVar7][1] + s->len_pack[uVar6][1] + s->len_pack[uVar8][1] +
                     s->len_pack[uVar9][1] + s->len_pack[uVar10][1] + s->len_pack[uVar11][1] +
                     s->len_pack[uVar12][1] + s->len_pack[uVar13][1] + s->len_pack[uVar14][1] +
                     s->len_pack[uVar15][1] + s->len_pack[uVar16][1] + s->len_pack[uVar17][1] +
                     s->len_pack[uVar18][1] + s->len_pack[uVar19][1] + s->len_pack[uVar20][1] +
                     s->len_pack[uVar21][1] + s->len_pack[uVar22][1] + s->len_pack[uVar23][1] +
                     s->len_pack[uVar24][1] + s->len_pack[uVar25][1] + s->len_pack[uVar26][1] +
                     s->len_pack[uVar27][1] + s->len_pack[uVar28][1] + s->len_pack[uVar29][1] +
                     s->len_pack[uVar30][1] + s->len_pack[uVar31][1] + s->len_pack[uVar32][1] +
                     s->len_pack[uVar33][1] + s->len_pack[uVar34][1] + s->len_pack[uVar35][1] +
                     s->len_pack[uVar36][1] + s->len_pack[uVar37][1] + s->len_pack[uVar38][1] +
                     s->len_pack[uVar39][1] + s->len_pack[uVar40][1] + s->len_pack[uVar41][1] +
                     s->len_pack[uVar42][1] + s->len_pack[uVar43][1] + s->len_pack[uVar44][1] +
                     s->len_pack[uVar45][1] + s->len_pack[uVar46][1] + s->len_pack[uVar47][1] +
                     s->len_pack[uVar48][1] + s->len_pack[uVar49][1] + s->len_pack[uVar50][1] +
                     s->len_pack[uVar51][1] + s->len_pack[uVar52][1] + s->len_pack[uVar53][1] +
                     s->len_pack[uVar54][1] + s->len_pack[uVar55][1];
        cost._8_4_ = s->len_pack[uVar7][2] + s->len_pack[uVar6][2] + s->len_pack[uVar8][2] +
                     s->len_pack[uVar9][2] + s->len_pack[uVar10][2] + s->len_pack[uVar11][2] +
                     s->len_pack[uVar12][2] + s->len_pack[uVar13][2] + s->len_pack[uVar14][2] +
                     s->len_pack[uVar15][2] + s->len_pack[uVar16][2] + s->len_pack[uVar17][2] +
                     s->len_pack[uVar18][2] + s->len_pack[uVar19][2] + s->len_pack[uVar20][2] +
                     s->len_pack[uVar21][2] + s->len_pack[uVar22][2] + s->len_pack[uVar23][2] +
                     s->len_pack[uVar24][2] + s->len_pack[uVar25][2] + s->len_pack[uVar26][2] +
                     s->len_pack[uVar27][2] + s->len_pack[uVar28][2] + s->len_pack[uVar29][2] +
                     s->len_pack[uVar30][2] + s->len_pack[uVar31][2] + s->len_pack[uVar32][2] +
                     s->len_pack[uVar33][2] + s->len_pack[uVar34][2] + s->len_pack[uVar35][2] +
                     s->len_pack[uVar36][2] + s->len_pack[uVar37][2] + s->len_pack[uVar38][2] +
                     s->len_pack[uVar39][2] + s->len_pack[uVar40][2] + s->len_pack[uVar41][2] +
                     s->len_pack[uVar42][2] + s->len_pack[uVar43][2] + s->len_pack[uVar44][2] +
                     s->len_pack[uVar45][2] + s->len_pack[uVar46][2] + s->len_pack[uVar47][2] +
                     s->len_pack[uVar48][2] + s->len_pack[uVar49][2] + s->len_pack[uVar50][2] +
                     s->len_pack[uVar51][2] + s->len_pack[uVar52][2] + s->len_pack[uVar53][2] +
                     s->len_pack[uVar54][2] + s->len_pack[uVar55][2];
      }
      else {
        for (; lVar57 <= iVar61; lVar57 = lVar57 + 1) {
          pUVar79 = s->len[0] + pUVar56[lVar57];
          for (uVar71 = 0; uVar81 != uVar71; uVar71 = uVar71 + 1) {
            cost[uVar71] = cost[uVar71] + (ushort)*pUVar79;
            pUVar79 = pUVar79 + 0x102;
          }
        }
      }
      uVar71 = 0xffffffffffffffff;
      uVar70 = 999999999;
      for (uVar77 = 0; uVar81 != uVar77; uVar77 = uVar77 + 1) {
        uVar6 = cost[uVar77];
        uVar75 = uVar70;
        if (uVar6 <= uVar70) {
          uVar75 = (uint)uVar6;
        }
        if (uVar6 < uVar70) {
          uVar71 = uVar77;
        }
        uVar71 = uVar71 & 0xffffffff;
        uVar70 = uVar75;
      }
      iVar74 = (int)uVar71;
      fave[iVar74] = fave[iVar74] + 1;
      s->selector[local_198] = (UChar)uVar71;
      if (bVar73) {
        paIVar2[iVar74][pUVar56[lVar78]] = paIVar2[iVar74][pUVar56[lVar78]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 1]] = paIVar2[iVar74][pUVar56[lVar78 + 1]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 2]] = paIVar2[iVar74][pUVar56[lVar78 + 2]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 3]] = paIVar2[iVar74][pUVar56[lVar78 + 3]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 4]] = paIVar2[iVar74][pUVar56[lVar78 + 4]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 5]] = paIVar2[iVar74][pUVar56[lVar78 + 5]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 6]] = paIVar2[iVar74][pUVar56[lVar78 + 6]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 7]] = paIVar2[iVar74][pUVar56[lVar78 + 7]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 8]] = paIVar2[iVar74][pUVar56[lVar78 + 8]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 9]] = paIVar2[iVar74][pUVar56[lVar78 + 9]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 10]] = paIVar2[iVar74][pUVar56[lVar78 + 10]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0xb]] = paIVar2[iVar74][pUVar56[lVar78 + 0xb]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0xc]] = paIVar2[iVar74][pUVar56[lVar78 + 0xc]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0xd]] = paIVar2[iVar74][pUVar56[lVar78 + 0xd]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0xe]] = paIVar2[iVar74][pUVar56[lVar78 + 0xe]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0xf]] = paIVar2[iVar74][pUVar56[lVar78 + 0xf]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x10]] = paIVar2[iVar74][pUVar56[lVar78 + 0x10]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x11]] = paIVar2[iVar74][pUVar56[lVar78 + 0x11]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x12]] = paIVar2[iVar74][pUVar56[lVar78 + 0x12]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x13]] = paIVar2[iVar74][pUVar56[lVar78 + 0x13]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x14]] = paIVar2[iVar74][pUVar56[lVar78 + 0x14]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x15]] = paIVar2[iVar74][pUVar56[lVar78 + 0x15]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x16]] = paIVar2[iVar74][pUVar56[lVar78 + 0x16]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x17]] = paIVar2[iVar74][pUVar56[lVar78 + 0x17]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x18]] = paIVar2[iVar74][pUVar56[lVar78 + 0x18]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x19]] = paIVar2[iVar74][pUVar56[lVar78 + 0x19]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x1a]] = paIVar2[iVar74][pUVar56[lVar78 + 0x1a]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x1b]] = paIVar2[iVar74][pUVar56[lVar78 + 0x1b]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x1c]] = paIVar2[iVar74][pUVar56[lVar78 + 0x1c]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x1d]] = paIVar2[iVar74][pUVar56[lVar78 + 0x1d]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x1e]] = paIVar2[iVar74][pUVar56[lVar78 + 0x1e]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x1f]] = paIVar2[iVar74][pUVar56[lVar78 + 0x1f]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x20]] = paIVar2[iVar74][pUVar56[lVar78 + 0x20]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x21]] = paIVar2[iVar74][pUVar56[lVar78 + 0x21]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x22]] = paIVar2[iVar74][pUVar56[lVar78 + 0x22]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x23]] = paIVar2[iVar74][pUVar56[lVar78 + 0x23]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x24]] = paIVar2[iVar74][pUVar56[lVar78 + 0x24]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x25]] = paIVar2[iVar74][pUVar56[lVar78 + 0x25]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x26]] = paIVar2[iVar74][pUVar56[lVar78 + 0x26]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x27]] = paIVar2[iVar74][pUVar56[lVar78 + 0x27]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x28]] = paIVar2[iVar74][pUVar56[lVar78 + 0x28]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x29]] = paIVar2[iVar74][pUVar56[lVar78 + 0x29]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x2a]] = paIVar2[iVar74][pUVar56[lVar78 + 0x2a]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x2b]] = paIVar2[iVar74][pUVar56[lVar78 + 0x2b]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x2c]] = paIVar2[iVar74][pUVar56[lVar78 + 0x2c]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x2d]] = paIVar2[iVar74][pUVar56[lVar78 + 0x2d]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x2e]] = paIVar2[iVar74][pUVar56[lVar78 + 0x2e]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x2f]] = paIVar2[iVar74][pUVar56[lVar78 + 0x2f]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x30]] = paIVar2[iVar74][pUVar56[lVar78 + 0x30]] + 1;
        paIVar2[iVar74][pUVar56[lVar78 + 0x31]] = paIVar2[iVar74][pUVar56[lVar78 + 0x31]] + 1;
      }
      else {
        for (; lVar78 <= iVar61; lVar78 = lVar78 + 1) {
          paIVar2[iVar74][pUVar56[lVar78]] = paIVar2[iVar74][pUVar56[lVar78]] + 1;
        }
      }
      local_198 = local_198 + 1;
      iVar74 = iVar61 + 1;
    }
    uVar71 = uVar81;
    paIVar59 = paIVar2;
    paUVar64 = paUVar1;
    if (2 < s->verbosity) {
      fprintf(_stderr,"      pass %d: size is %d, grp uses are ",(ulong)(iVar69 + 1));
      for (uVar77 = 0; uVar81 != uVar77; uVar77 = uVar77 + 1) {
        fprintf(_stderr,"%d ",(ulong)(uint)fave[uVar77]);
      }
      fputc(10,_stderr);
    }
    while (uVar71 != 0) {
      BZ2_hbMakeCodeLengths(*paUVar64,*paIVar59,uVar80,0x11);
      uVar71 = uVar71 - 1;
      paIVar59 = paIVar59 + 1;
      paUVar64 = paUVar64 + 1;
    }
  }
  if (0x4652 < (uint)local_198) {
    BZ2_bz__AssertH__fail(0xbbb);
  }
  for (uVar71 = 0; uVar81 != uVar71; uVar71 = uVar71 + 1) {
    local_158[uVar71] = (UChar)uVar71;
  }
  for (uVar71 = 0; uVar71 != (local_198 & 0xffffffff); uVar71 = uVar71 + 1) {
    UVar68 = s->selector[uVar71];
    lVar57 = 0;
    while (UVar68 != local_158[0]) {
      UVar3 = local_158[lVar57 + 1];
      local_158[lVar57 + 1] = local_158[0];
      lVar57 = lVar57 + 1;
      local_158[0] = UVar3;
    }
    s->selectorMtf[uVar71] = (UChar)lVar57;
    local_158[0] = UVar68;
  }
  paUVar64 = paUVar1;
  for (uVar71 = 0; uVar71 != uVar81; uVar71 = uVar71 + 1) {
    uVar70 = 0;
    uVar75 = 0x20;
    for (uVar77 = 0; uVar72 != uVar77; uVar77 = uVar77 + 1) {
      uVar62 = (uint)(*paUVar64)[uVar77];
      if (uVar70 <= (*paUVar64)[uVar77]) {
        uVar70 = uVar62;
      }
      if (uVar62 <= uVar75) {
        uVar75 = uVar62;
      }
    }
    if (0x11 < uVar70) {
      BZ2_bz__AssertH__fail(0xbbc);
    }
    if (uVar75 == 0) {
      BZ2_bz__AssertH__fail(0xbbd);
    }
    BZ2_hbAssignCodes(s->code[uVar71],paUVar1[uVar71],uVar75,uVar70,uVar80);
    paUVar64 = paUVar64 + 1;
  }
  pBVar65 = local_178;
  for (lVar57 = 0; lVar57 != 0x10; lVar57 = lVar57 + 1) {
    local_158[lVar57] = '\0';
    for (lVar78 = 0; lVar78 != 0x10; lVar78 = lVar78 + 1) {
      if (pBVar65[lVar78] != '\0') {
        local_158[lVar57] = '\x01';
      }
    }
    pBVar65 = pBVar65 + 0x10;
  }
  iVar69 = s->numZ;
  for (lVar57 = 0; lVar57 != 0x10; lVar57 = lVar57 + 1) {
    bsW(s,1,(uint)(local_158[lVar57] != '\0'));
  }
  for (lVar57 = 0; lVar57 != 0x10; lVar57 = lVar57 + 1) {
    if (local_158[lVar57] != '\0') {
      for (lVar78 = 0; lVar78 != 0x10; lVar78 = lVar78 + 1) {
        bsW(s,1,(uint)(local_178[lVar78] != '\0'));
      }
    }
    local_178 = local_178 + 0x10;
  }
  iVar74 = s->numZ;
  if (2 < s->verbosity) {
    fprintf(_stderr,"      bytes: mapping %d, ",(ulong)(uint)(iVar74 - iVar69));
    iVar74 = s->numZ;
  }
  bsW(s,3,v);
  bsW(s,0xf,(uint)local_198);
  for (uVar71 = 0; uVar71 != (local_198 & 0xffffffff); uVar71 = uVar71 + 1) {
    for (uVar80 = 0; uVar80 < s->selectorMtf[uVar71]; uVar80 = uVar80 + 1) {
      bsW(s,1,1);
    }
    bsW(s,1,0);
  }
  if (2 < s->verbosity) {
    fprintf(_stderr,"selectors %d, ",(ulong)(uint)(s->numZ - iVar74));
  }
  iVar69 = s->numZ;
  for (uVar71 = 0; uVar71 != uVar81; uVar71 = uVar71 + 1) {
    uVar80 = (uint)paUVar1[uVar71][0];
    bsW(s,5,(uint)paUVar1[uVar71][0]);
    for (uVar77 = 0; uVar77 != uVar72; uVar77 = uVar77 + 1) {
      for (; bVar5 = paUVar1[uVar71][uVar77], (int)uVar80 < (int)(uint)bVar5; uVar80 = uVar80 + 1) {
        bsW(s,2,2);
      }
      while (bVar5 < uVar80) {
        bsW(s,2,3);
        uVar80 = uVar80 - 1;
        bVar5 = paUVar1[uVar71][uVar77];
      }
      bsW(s,1,0);
    }
  }
  iVar74 = s->numZ;
  if (2 < s->verbosity) {
    fprintf(_stderr,"code lengths %d, ",(ulong)(uint)(iVar74 - iVar69));
    iVar74 = s->numZ;
  }
  lVar57 = 0;
  iVar69 = 0;
  while (iVar66 = s->nMTF, iVar69 < iVar66) {
    iVar61 = iVar66 + -1;
    if (iVar69 + 0x31 < iVar66) {
      iVar61 = iVar69 + 0x31;
    }
    if (v <= s->selector[lVar57]) {
      BZ2_bz__AssertH__fail(0xbbe);
    }
    if ((bool)(bVar83 & iVar61 - iVar69 == 0x31)) {
      bVar5 = s->selector[lVar57];
      bsW(s,(uint)paUVar1[bVar5][pUVar56[iVar69]],s->code[bVar5][pUVar56[iVar69]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 1]],
          s->code[bVar5][pUVar56[(long)iVar69 + 1]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 2]],
          s->code[bVar5][pUVar56[(long)iVar69 + 2]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 3]],
          s->code[bVar5][pUVar56[(long)iVar69 + 3]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 4]],
          s->code[bVar5][pUVar56[(long)iVar69 + 4]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 5]],
          s->code[bVar5][pUVar56[(long)iVar69 + 5]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 6]],
          s->code[bVar5][pUVar56[(long)iVar69 + 6]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 7]],
          s->code[bVar5][pUVar56[(long)iVar69 + 7]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 8]],
          s->code[bVar5][pUVar56[(long)iVar69 + 8]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 9]],
          s->code[bVar5][pUVar56[(long)iVar69 + 9]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 10]],
          s->code[bVar5][pUVar56[(long)iVar69 + 10]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0xb]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0xb]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0xc]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0xc]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0xd]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0xd]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0xe]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0xe]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0xf]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0xf]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x10]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x10]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x11]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x11]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x12]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x12]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x13]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x13]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x14]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x14]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x15]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x15]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x16]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x16]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x17]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x17]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x18]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x18]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x19]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x19]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x1a]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x1a]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x1b]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x1b]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x1c]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x1c]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x1d]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x1d]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x1e]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x1e]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x1f]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x1f]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x20]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x20]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x21]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x21]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x22]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x22]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x23]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x23]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x24]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x24]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x25]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x25]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x26]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x26]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x27]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x27]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x28]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x28]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x29]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x29]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x2a]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x2a]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x2b]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x2b]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x2c]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x2c]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x2d]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x2d]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x2e]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x2e]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x2f]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x2f]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x30]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x30]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar69 + 0x31]],
          s->code[bVar5][pUVar56[(long)iVar69 + 0x31]]);
    }
    else {
      for (lVar78 = (long)iVar69; lVar78 <= iVar61; lVar78 = lVar78 + 1) {
        bsW(s,(uint)paUVar1[s->selector[lVar57]][pUVar56[lVar78]],
            s->code[s->selector[lVar57]][pUVar56[lVar78]]);
      }
    }
    lVar57 = lVar57 + 1;
    iVar69 = iVar61 + 1;
  }
  if ((uint)local_198 != (uint)lVar57) {
    BZ2_bz__AssertH__fail(0xbbf);
  }
  is_last_block = (Bool_conflict)local_144;
  if (2 < s->verbosity) {
    fprintf(_stderr,"codes %d\n",(ulong)(uint)(s->numZ - iVar74));
  }
LAB_001bc486:
  if (is_last_block != '\0') {
    bsPutUChar(s,'\x17');
    bsPutUChar(s,'r');
    bsPutUChar(s,'E');
    bsPutUChar(s,'8');
    bsPutUChar(s,'P');
    bsPutUChar(s,0x90);
    bsPutUInt32(s,s->combinedCRC);
    if (1 < s->verbosity) {
      fprintf(_stderr,"    final combined CRC = 0x%08x\n   ",(ulong)s->combinedCRC);
    }
    iVar69 = s->bsLive;
    while (0 < iVar69) {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar69 = s->bsLive + -8;
      s->bsLive = iVar69;
    }
  }
  return;
}

Assistant:

void BZ2_compressBlock ( EState* s, Bool is_last_block )
{
   if (s->nblock > 0) {

      BZ_FINALISE_CRC ( s->blockCRC );
      s->combinedCRC = (s->combinedCRC << 1) | (s->combinedCRC >> 31);
      s->combinedCRC ^= s->blockCRC;
      if (s->blockNo > 1) s->numZ = 0;

      if (s->verbosity >= 2)
         VPrintf4( "    block %d: crc = 0x%08x, "
                   "combined CRC = 0x%08x, size = %d\n",
                   s->blockNo, s->blockCRC, s->combinedCRC, s->nblock );

      BZ2_blockSort ( s );
   }

   s->zbits = (UChar*) (&((UChar*)s->arr2)[s->nblock]);

   /*-- If this is the first block, create the stream header. --*/
   if (s->blockNo == 1) {
      BZ2_bsInitWrite ( s );
      bsPutUChar ( s, BZ_HDR_B );
      bsPutUChar ( s, BZ_HDR_Z );
      bsPutUChar ( s, BZ_HDR_h );
      bsPutUChar ( s, (UChar)(BZ_HDR_0 + s->blockSize100k) );
   }

   if (s->nblock > 0) {

      bsPutUChar ( s, 0x31 ); bsPutUChar ( s, 0x41 );
      bsPutUChar ( s, 0x59 ); bsPutUChar ( s, 0x26 );
      bsPutUChar ( s, 0x53 ); bsPutUChar ( s, 0x59 );

      /*-- Now the block's CRC, so it is in a known place. --*/
      bsPutUInt32 ( s, s->blockCRC );

      /*-- 
         Now a single bit indicating (non-)randomisation. 
         As of version 0.9.5, we use a better sorting algorithm
         which makes randomisation unnecessary.  So always set
         the randomised bit to 'no'.  Of course, the decoder
         still needs to be able to handle randomised blocks
         so as to maintain backwards compatibility with
         older versions of bzip2.
      --*/
      bsW(s,1,0);

      bsW ( s, 24, s->origPtr );
      generateMTFValues ( s );
      sendMTFValues ( s );
   }


   /*-- If this is the last block, add the stream trailer. --*/
   if (is_last_block) {

      bsPutUChar ( s, 0x17 ); bsPutUChar ( s, 0x72 );
      bsPutUChar ( s, 0x45 ); bsPutUChar ( s, 0x38 );
      bsPutUChar ( s, 0x50 ); bsPutUChar ( s, 0x90 );
      bsPutUInt32 ( s, s->combinedCRC );
      if (s->verbosity >= 2)
         VPrintf1( "    final combined CRC = 0x%08x\n   ", s->combinedCRC );
      bsFinishWrite ( s );
   }
}